

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norm.c
# Opt level: O3

double residual_norm_L2(double *approximation,uint dimension,double *space_coordinate,
                       double time_upper_boundary,_func_double_double_double *approximated)

{
  double dVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  
  dVar4 = 0.0;
  if (dimension != 0) {
    uVar2 = 0;
    do {
      dVar1 = approximation[uVar2];
      dVar3 = (*approximated)(space_coordinate[uVar2],time_upper_boundary);
      dVar4 = dVar4 + (dVar1 - dVar3) * (dVar1 - dVar3);
      uVar2 = uVar2 + 1;
    } while (dimension != uVar2);
  }
  dVar4 = dVar4 / (double)dimension;
  if (0.0 <= dVar4) {
    return SQRT(dVar4);
  }
  dVar4 = sqrt(dVar4);
  return dVar4;
}

Assistant:

double residual_norm_L2 (double const * approximation, 
                        unsigned dimension, 
                        double const * space_coordinate, 
                        double time_upper_boundary,
                        double (*approximated) (double, double)) {
  double norm = 0.;
  unsigned space_step;
  for (space_step = 0; space_step < dimension; ++space_step) {
    norm += square (approximation[space_step] - approximated (space_coordinate[space_step], time_upper_boundary));
  }
  norm = sqrt (norm / (double) dimension);
  return norm;
}